

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

string_t *
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::escape_string(string_t *__return_storage_ptr__,string_t *s)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  undefined1 *puVar5;
  const_iterator pcVar6;
  char *pcVar7;
  char m;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  initializer_list<char> local_78;
  initializer_list<char> *local_68;
  initializer_list<char> *__range6;
  char *c;
  const_iterator __end0;
  const_iterator __begin0;
  string_t *__range2;
  size_t pos;
  allocator local_22;
  undefined1 local_21;
  size_t local_20;
  size_t space;
  string_t *s_local;
  string_t *result;
  
  space = (size_t)s;
  s_local = __return_storage_ptr__;
  local_20 = extra_space(s);
  if (local_20 == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)space);
  }
  else {
    local_21 = 0;
    lVar3 = std::__cxx11::string::size();
    uVar4 = lVar3 + local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,uVar4,'\\',&local_22);
    std::allocator<char>::~allocator((allocator<char> *)&local_22);
    __end0._M_current = (char *)std::__cxx11::string::begin();
    c = (char *)std::__cxx11::string::end();
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&c), bVar2) {
      __range6 = (initializer_list<char> *)
                 __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end0);
      cVar1 = *(char *)&__range6->_M_array;
      if (cVar1 == '\b') {
        puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
        *puVar5 = 0x62;
      }
      else if (cVar1 == '\t') {
        puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
        *puVar5 = 0x74;
      }
      else if (cVar1 == '\n') {
        puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
        *puVar5 = 0x6e;
      }
      else if (cVar1 == '\f') {
        puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
        *puVar5 = 0x66;
      }
      else if (cVar1 == '\r') {
        puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
        *puVar5 = 0x72;
      }
      else if (cVar1 == '\"') {
        puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
        *puVar5 = 0x22;
      }
      else if (cVar1 != '\\') {
        if ((*(char *)&__range6->_M_array < '\0') || ('\x1f' < *(char *)&__range6->_M_array)) {
          cVar1 = *(char *)&__range6->_M_array;
          pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
          *pcVar7 = cVar1;
        }
        else {
          __begin0_1._3_1_ = 0x75;
          __begin0_1._4_1_ = 0x30;
          __begin0_1._5_1_ = 0x30;
          __begin0_1._6_1_ = "0123456789abcdef"[(int)*(char *)&__range6->_M_array >> 4];
          __begin0_1._7_1_ = "0123456789abcdef"[(int)((int)*(char *)&__range6->_M_array & 0xf)];
          local_78._M_array = (iterator)((long)&__begin0_1 + 3);
          local_78._M_len = 5;
          local_68 = &local_78;
          __end0_1 = std::initializer_list<char>::begin(local_68);
          pcVar6 = std::initializer_list<char>::end(local_68);
          for (; __end0_1 != pcVar6; __end0_1 = __end0_1 + 1) {
            cVar1 = *__end0_1;
            pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
            *pcVar7 = cVar1;
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static string_t escape_string(const string_t& s)
    {
        const auto space = extra_space(s);
        if (space == 0)
        {
            return s;
        }

        // create a result string of necessary size
        string_t result(s.size() + space, '\\');
        std::size_t pos = 0;

        for (const auto& c : s)
        {
            switch (c)
            {
                // quotation mark (0x22)
                case '"':
                {
                    result[pos + 1] = '"';
                    pos += 2;
                    break;
                }

                // reverse solidus (0x5c)
                case '\\':
                {
                    // nothing to change
                    pos += 2;
                    break;
                }

                // backspace (0x08)
                case '\b':
                {
                    result[pos + 1] = 'b';
                    pos += 2;
                    break;
                }

                // formfeed (0x0c)
                case '\f':
                {
                    result[pos + 1] = 'f';
                    pos += 2;
                    break;
                }

                // newline (0x0a)
                case '\n':
                {
                    result[pos + 1] = 'n';
                    pos += 2;
                    break;
                }

                // carriage return (0x0d)
                case '\r':
                {
                    result[pos + 1] = 'r';
                    pos += 2;
                    break;
                }

                // horizontal tab (0x09)
                case '\t':
                {
                    result[pos + 1] = 't';
                    pos += 2;
                    break;
                }

                default:
                {
                    if (c >= 0x00 and c <= 0x1f)
                    {
                        // convert a number 0..15 to its hex representation
                        // (0..f)
                        static const char hexify[16] =
                        {
                            '0', '1', '2', '3', '4', '5', '6', '7',
                            '8', '9', 'a', 'b', 'c', 'd', 'e', 'f'
                        };

                        // print character c as \uxxxx
                        for (const char m :
                    { 'u', '0', '0', hexify[c >> 4], hexify[c & 0x0f]
                        })
                        {
                            result[++pos] = m;
                        }

                        ++pos;
                    }
                    else
                    {
                        // all other characters are added as-is
                        result[pos++] = c;
                    }
                    break;
                }
            }
        }

        return result;
    }